

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<kj::String> __thiscall
kj::AsyncInputStream::readAllText(AsyncInputStream *this,uint64_t limit)

{
  PromiseArena *pPVar1;
  OwnPromiseNode node;
  Disposer *pDVar2;
  RemoveConst<kj::Array<unsigned_char>_> *pRVar3;
  AllReader *limit_00;
  void *pvVar4;
  PromiseArena *in_RDX;
  TransformPromiseNodeBase *this_00;
  AllReader *ptrCopy;
  Promise<kj::String> promise;
  OwnPromiseNode local_50;
  Own<kj::(anonymous_namespace)::AllReader,_std::nullptr_t> local_48;
  RemoveConst<kj::Array<unsigned_char>_> *local_38;
  
  limit_00 = (AllReader *)operator_new(0x28);
  limit_00->input = (AsyncInputStream *)limit;
  (limit_00->parts).builder.ptr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  (limit_00->parts).builder.endPtr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  anon_unknown_123::AllReader::loop((AllReader *)&local_48,(uint64_t)limit_00);
  pDVar2 = local_48.disposer;
  pPVar1 = *(PromiseArena **)((long)local_48.disposer + 8);
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_48.disposer - (long)pPVar1) < 0x30) {
    pvVar4 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:169:29)>
               ::anon_class_16_2_f81c8ca8_for_func::operator());
    *(undefined ***)((long)pvVar4 + 0x3d0) = &PTR_destroy_0070a2f0;
    *(AllReader **)((long)pvVar4 + 0x3f0) = limit_00;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_RDX;
    *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
  }
  else {
    *(PromiseArena **)((long)local_48.disposer + 8) = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)((long)local_48.disposer + -0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)&local_48,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:169:29)>
               ::anon_class_16_2_f81c8ca8_for_func::operator());
    ((PromiseArenaMember *)((long)pDVar2 + -0x30))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0070a2f0;
    ((PromiseArenaMember *)((long)pDVar2 + -0x10))->_vptr_PromiseArenaMember =
         (_func_int **)limit_00;
    ((PromiseArenaMember *)((long)pDVar2 + -0x10))->arena = in_RDX;
    ((PromiseArenaMember *)((long)pDVar2 + -0x30))->arena = pPVar1;
  }
  pDVar2 = local_48.disposer;
  local_50.ptr = &this_00->super_PromiseNode;
  if ((PromiseArenaMember *)local_48.disposer != (PromiseArenaMember *)0x0) {
    local_48.disposer = (Disposer *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pDVar2);
  }
  local_48.disposer =
       (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AllReader>::instance;
  local_48.ptr = limit_00;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::(anonymous_namespace)::AllReader,decltype(nullptr)>>
            ((PromiseDisposer *)&local_38,&local_50,&local_48);
  pRVar3 = local_38;
  local_38 = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  this->_vptr_AsyncInputStream = (_func_int **)pRVar3;
  if (local_48.ptr != (AllReader *)0x0) {
    local_48.ptr = (AllReader *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)();
  }
  node.ptr = local_50.ptr;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<String> AsyncInputStream::readAllText(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllText(limit);
  return promise.attach(kj::mv(reader));
}